

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

size_t __thiscall docopt::Option::hash(Option *this)

{
  size_t local_18;
  size_t seed;
  Option *this_local;
  
  seed = (size_t)this;
  local_18 = LeafPattern::hash(&this->super_LeafPattern);
  hash_combine<std::__cxx11::string>(&local_18,&this->fShortOption);
  hash_combine<std::__cxx11::string>(&local_18,&this->fLongOption);
  hash_combine<int>(&local_18,&this->fArgcount);
  return local_18;
}

Assistant:

virtual size_t hash() const override {
			size_t seed = LeafPattern::hash();
			hash_combine(seed, fShortOption);
			hash_combine(seed, fLongOption);
			hash_combine(seed, fArgcount);
			return seed;
		}